

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test_generated.h
# Opt level: O0

bool __thiscall SmallStructs::Verify(SmallStructs *this,Verifier *verifier)

{
  bool bVar1;
  Vector<const_EvenSmallStruct_*,_unsigned_int> *vec;
  Vector<const_OddSmallStruct_*,_unsigned_int> *vec_00;
  undefined1 local_19;
  Verifier *verifier_local;
  SmallStructs *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,4);
    local_19 = false;
    if (bVar1) {
      vec = even_structs(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<EvenSmallStruct,_unsigned_int>
                        (verifier,vec);
      local_19 = false;
      if (bVar1) {
        bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6);
        local_19 = false;
        if (bVar1) {
          vec_00 = odd_structs(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<OddSmallStruct,_unsigned_int>
                            (verifier,vec_00);
          local_19 = false;
          if (bVar1) {
            local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset(verifier, VT_EVEN_STRUCTS) &&
           verifier.VerifyVector(even_structs()) &&
           VerifyOffset(verifier, VT_ODD_STRUCTS) &&
           verifier.VerifyVector(odd_structs()) &&
           verifier.EndTable();
  }